

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

void __thiscall Fl_Browser::item_draw(Fl_Browser *this,void *item,int X,int Y,int W,int H)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long *plVar5;
  Fl_Align align;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  Fl_Color FVar9;
  int iVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  undefined4 in_register_0000000c;
  uint uVar13;
  ulong uVar14;
  byte *__nptr;
  undefined4 in_register_0000008c;
  ulong uVar15;
  ulong uVar16;
  byte *local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  ulong local_90;
  char *local_88;
  ulong local_80;
  uint local_78;
  uint local_74;
  uint *local_70;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  uint uVar4;
  
  local_50 = CONCAT44(in_register_0000008c,H);
  local_58 = CONCAT44(in_register_0000000c,Y);
  uVar14 = (ulong)(uint)W;
  uVar16 = (ulong)(uint)X;
  local_a8 = (byte *)((long)item + 0x23);
  local_70 = (uint *)this->column_widths_;
  local_68 = Y + 1;
  local_5c = (Y + H) - 1;
  local_60 = H / 2 + Y + 1;
  local_64 = H / 2 + Y;
  local_94 = (uint)CONCAT71((uint7)(uint3)(local_64 >> 8),1);
  local_48 = item;
  do {
    uVar13 = (uint)uVar14;
    if ((int)uVar13 < 7) {
      return;
    }
    if ((*local_70 == 0) ||
       (local_88 = strchr((char *)local_a8,(int)this->column_char_), local_88 == (char *)0x0)) {
      local_88 = (char *)0x0;
    }
    else {
      *local_88 = '\0';
      uVar14 = (ulong)*local_70;
      local_70 = local_70 + 1;
    }
    if ((local_94 & 1) != 0) {
      plVar5 = *(long **)((long)item + 0x18);
      if (plVar5 == (long *)0x0) {
        local_94 = 0;
      }
      else {
        local_94 = 0;
        (**(code **)(*plVar5 + 0x38))
                  (plVar5,(int)uVar16 + 2,local_68,(int)plVar5[1],
                   *(undefined4 *)((long)plVar5 + 0xc),0,0);
        iVar10 = *(int *)(*(long *)((long)item + 0x18) + 8);
        iVar8 = iVar10 + 2;
        uVar13 = uVar13 - iVar8;
        uVar16 = (ulong)((int)uVar16 + iVar10 + 2);
        uVar14 = (ulong)(uint)((int)uVar14 - iVar8);
      }
    }
    local_80 = uVar14;
    local_90 = uVar16;
    local_9c = uVar13;
    uVar14 = (ulong)(uint)(this->super_Fl_Browser_).textfont_;
    uVar16 = (ulong)(uint)(this->super_Fl_Browser_).textsize_;
    uVar15 = (ulong)(this->super_Fl_Browser_).textcolor_;
    bVar7 = this->format_char_;
    if (*local_a8 == bVar7) {
      local_74 = (int)local_90 + 3;
      local_78 = ((int)local_90 + (int)local_80) - 3;
      local_98 = 4;
      do {
        pbVar1 = local_a8 + 1;
        bVar2 = local_a8[1];
        if ((bVar2 == 0) || (bVar2 == bVar7)) break;
        __nptr = local_a8 + 2;
        if (bVar2 < 0x5f) {
          switch(bVar2) {
          case 0x40:
            goto LAB_001b55cf;
          case 0x41:
          case 0x44:
          case 0x45:
          case 0x47:
          case 0x48:
          case 0x49:
          case 0x4a:
          case 0x4b:
          case 0x4f:
          case 0x50:
          case 0x51:
          case 0x52:
            break;
          case 0x42:
            if ((*(byte *)((long)local_48 + 0x22) & 1) == 0) {
              local_a8 = __nptr;
              uVar11 = strtol((char *)__nptr,(char **)&local_a8,10);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,uVar11 & 0xffffffff);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                        (fl_graphics_driver,local_90,local_58,local_80,local_50);
              __nptr = local_a8;
            }
            else {
              __nptr = local_a8 + 1;
              do {
                pbVar1 = __nptr + 1;
                __nptr = __nptr + 1;
              } while (*pbVar1 - 0x30 < 10);
            }
            break;
          case 0x43:
            local_a8 = __nptr;
            uVar15 = strtol((char *)__nptr,(char **)&local_a8,10);
            __nptr = local_a8;
            break;
          case 0x46:
            local_a8 = __nptr;
            uVar14 = strtol((char *)__nptr,(char **)&local_a8,10);
            __nptr = local_a8;
            break;
          case 0x4c:
            goto switchD_001b53d8_caseD_6c;
          case 0x4d:
            goto switchD_001b53d8_caseD_6d;
          case 0x4e:
            uVar15 = 8;
            break;
          case 0x53:
            local_a8 = __nptr;
            uVar16 = strtol((char *)__nptr,(char **)&local_a8,10);
            __nptr = local_a8;
            break;
          default:
            if (bVar2 == 0x2d) {
              local_a8 = __nptr;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,0x27);
              uVar4 = local_74;
              uVar13 = local_78;
              local_40 = uVar14;
              local_38 = uVar15;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                        (fl_graphics_driver,(ulong)local_74,(ulong)local_64,(ulong)local_78,
                         (ulong)local_64);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,0x36);
              pp_Var12 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
              uVar14 = local_40;
              uVar15 = local_38;
              uVar3 = local_60;
              goto LAB_001b5522;
            }
            pbVar1 = __nptr;
            if (bVar2 == 0x2e) goto LAB_001b55cf;
          }
        }
        else {
          switch(bVar2) {
          case 0x5f:
          case 0x75:
            local_a8 = __nptr;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,uVar15 & 0xffffffff);
            pp_Var12 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
            uVar13 = local_78;
            uVar3 = local_5c;
            uVar4 = local_74;
LAB_001b5522:
            (*pp_Var12[0xc])(fl_graphics_driver,(ulong)uVar4,(ulong)uVar3,(ulong)uVar13,(ulong)uVar3
                            );
            __nptr = local_a8;
            break;
          case 0x62:
            uVar14 = (ulong)((uint)uVar14 | 1);
            break;
          case 99:
            local_98 = 0;
            break;
          case 0x66:
          case 0x74:
            uVar14 = 4;
            break;
          case 0x69:
            uVar14 = (ulong)((uint)uVar14 | 2);
            break;
          case 0x6c:
switchD_001b53d8_caseD_6c:
            uVar16 = 0x18;
            break;
          case 0x6d:
switchD_001b53d8_caseD_6d:
            uVar16 = 0x12;
            break;
          case 0x72:
            local_98 = 8;
            break;
          case 0x73:
            uVar16 = 0xb;
          }
        }
        local_a8 = __nptr;
        bVar7 = this->format_char_;
        pbVar1 = local_a8;
      } while (*local_a8 == bVar7);
    }
    else {
      local_98 = 4;
      pbVar1 = local_a8;
    }
LAB_001b55cf:
    local_a8 = pbVar1;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,uVar14 & 0xffffffff,uVar16 & 0xffffffff);
    item = local_48;
    if ((*(byte *)((long)local_48 + 0x22) & 1) != 0) {
      FVar9 = fl_contrast((Fl_Color)uVar15,
                          (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.color2_);
      uVar15 = (ulong)FVar9;
    }
    uVar16 = local_90;
    iVar10 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar10 == 0) {
      FVar9 = fl_inactive((Fl_Color)uVar15);
      uVar15 = (ulong)FVar9;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,uVar15 & 0xffffffff);
    pcVar6 = local_88;
    iVar10 = (int)local_80;
    align = local_98 | 0x40;
    if (local_88 == (char *)0x0) {
      align = local_98;
    }
    fl_draw((char *)local_a8,(int)uVar16 + 3,(int)local_58,iVar10 + -6,(int)local_50,align,
            (Fl_Image *)0x0,0);
    uVar13 = local_9c;
    if (pcVar6 != (char *)0x0) {
      *local_88 = this->column_char_;
      uVar16 = (ulong)(uint)((int)uVar16 + iVar10);
      local_a8 = (byte *)(local_88 + 1);
      uVar13 = local_9c - iVar10;
    }
    uVar14 = (ulong)uVar13;
    if (local_88 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Fl_Browser::item_draw(void* item, int X, int Y, int W, int H) const {
  FL_BLINE* l = (FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();

  bool first = true;	// for icon
  while (W > 6) {	// do each tab-separated field
    int w1 = W;	// width for this field
    char* e = 0; // pointer to end of field or null if none
    if (*i) { // find end of field and temporarily replace with 0
      e = strchr(str, column_char());
      if (e) {*e = 0; w1 = *i++;}
    }
    // Icon drawing code
    if (first) {
      first = false;
      if (l->icon) {
	l->icon->draw(X+2,Y+1);	// leave 2px left, 1px above
	int iconw = l->icon->w()+2;
	X += iconw; W -= iconw; w1 -= iconw;
      }
    }
    int tsize = textsize();
    Fl_Font font = textfont();
    Fl_Color lcol = textcolor();
    Fl_Align talign = FL_ALIGN_LEFT;
    // check for all the @-lines recognized by XForms:
    //#if defined(__GNUC__)
    //#warning FIXME This maybe needs to be more UTF8 aware now...?
    //#endif /*__GNUC__*/
    while (*str == format_char() && *++str && *str != format_char()) {
      switch (*str++) {
      case 'l': case 'L': tsize = 24; break;
      case 'm': case 'M': tsize = 18; break;
      case 's': tsize = 11; break;
      case 'b': font = (Fl_Font)(font|FL_BOLD); break;
      case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
      case 'f': case 't': font = FL_COURIER; break;
      case 'c': talign = FL_ALIGN_CENTER; break;
      case 'r': talign = FL_ALIGN_RIGHT; break;
      case 'B': 
	if (!(l->flags & SELECTED)) {
	  fl_color((Fl_Color)strtol(str, &str, 10));
	  fl_rectf(X, Y, w1, H);
	} else while (isdigit(*str & 255)) str++; // skip digits
        break;
      case 'C':
	lcol = (Fl_Color)strtol(str, &str, 10);
	break;
      case 'F':
	font = (Fl_Font)strtol(str, &str, 10);
	break;
      case 'N':
	lcol = FL_INACTIVE_COLOR;
	break;
      case 'S':
	tsize = strtol(str, &str, 10);
	break;
      case '-':
	fl_color(FL_DARK3);
	fl_line(X+3, Y+H/2, X+w1-3, Y+H/2);
	fl_color(FL_LIGHT3);
	fl_line(X+3, Y+H/2+1, X+w1-3, Y+H/2+1);
	break;
      case 'u':
      case '_':
	fl_color(lcol);
	fl_line(X+3, Y+H-1, X+w1-3, Y+H-1);
	break;
      case '.':
	goto BREAK;
      case '@':
	str--; goto BREAK;
      }
    }
  BREAK:
    fl_font(font, tsize);
    if (l->flags & SELECTED)
      lcol = fl_contrast(lcol, selection_color());
    if (!active_r()) lcol = fl_inactive(lcol);
    fl_color(lcol);
    fl_draw(str, X+3, Y, w1-6, H, e ? Fl_Align(talign|FL_ALIGN_CLIP) : talign, 0, 0);
    if (!e) break; // no more fields...
    *e = column_char(); // put the separator back
    X += w1;
    W -= w1;
    str = e+1;
  }
}